

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

bool __thiscall
Assimp::MD5Importer::CanRead(MD5Importer *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  MD5Importer *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"md5anim");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"md5mesh");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"md5camera");
      if (!bVar1) {
        lVar2 = std::__cxx11::string::length();
        if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
          if (pIOHandler == (IOSystem *)0x0) {
            this_local._7_1_ = true;
          }
          else {
            local_68 = "MD5Version";
            this_local._7_1_ =
                 BaseImporter::SearchFileHeaderForToken
                           (pIOHandler,pFile,&local_68,1,200,false,false);
          }
        }
        else {
          this_local._7_1_ = false;
        }
        goto LAB_00691f72;
      }
    }
  }
  this_local._7_1_ = true;
LAB_00691f72:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool MD5Importer::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "md5anim" || extension == "md5mesh" || extension == "md5camera")
        return true;
    else if (!extension.length() || checkSig)   {
        if (!pIOHandler) {
            return true;
        }
        const char* tokens[] = {"MD5Version"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}